

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeMeasure.h
# Opt level: O2

void __thiscall dg::debug::TimeMeasure::report(TimeMeasure *this,string *prefix,ostream *out)

{
  ostream *poVar1;
  
  (this->elapsed).__r = (this->e).__d.__r - (this->s).__d.__r;
  poVar1 = std::operator<<(out,(string *)prefix);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)out);
  poVar1 = std::operator<<(poVar1," sec ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void report(const std::string &prefix = "", std::ostream &out = std::cerr) {
        // compute the duration
        duration();

        out << prefix << " ";

        const auto msec =
                std::chrono::duration_cast<std::chrono::milliseconds>(elapsed)
                        .count() %
                ms_in_sec;
        const auto sec =
                std::chrono::duration_cast<std::chrono::seconds>(elapsed)
                        .count();
        out << sec << " sec " << msec << " ms" << std::endl;
    }